

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_context_open_pcm__alsa
                    (ma_context *pContext,ma_share_mode shareMode,ma_device_type deviceType,
                    ma_device_id *pDeviceID,wchar_t openMode,ma_snd_pcm_t **ppPCM)

{
  int iVar1;
  ma_result mVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  ma_snd_pcm_t *pPCM;
  ma_device_id_conflict deviceID;
  char hwid [256];
  ma_snd_pcm_t *local_248;
  ma_snd_pcm_t **local_240;
  undefined4 local_238;
  undefined4 uStack_234;
  char *pcStack_230;
  char *local_228;
  char *pcStack_220;
  char *local_218;
  char *pcStack_210;
  char *local_208;
  char local_138 [264];
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a46,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  if (ppPCM == (ma_snd_pcm_t **)0x0) {
    __assert_fail("ppPCM != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a47,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  *ppPCM = (ma_snd_pcm_t *)0x0;
  local_248 = (ma_snd_pcm_t *)0x0;
  uVar8 = (ulong)(deviceType != ma_device_type_playback);
  local_240 = ppPCM;
  if (pDeviceID == (ma_device_id *)0x0) {
    local_208 = (char *)0x0;
    local_218 = (char *)0x0;
    pcStack_210 = (char *)0x0;
    local_238 = 0x1b37f6;
    uStack_234 = 0;
    if (shareMode == ma_share_mode_exclusive) {
      pcStack_230 = "hw";
      local_228 = "hw:0";
      pcStack_220 = "hw:0,0";
    }
    else {
      bVar9 = deviceType != ma_device_type_playback;
      pcStack_230 = "dmix";
      if (bVar9) {
        pcStack_230 = "dsnoop";
      }
      local_228 = "dmix:0";
      if (bVar9) {
        local_228 = "dsnoop:0";
      }
      pcStack_220 = "dmix:0,0";
      if (bVar9) {
        pcStack_220 = "dsnoop:0,0";
      }
      local_218 = "hw";
      pcStack_210 = "hw:0";
      local_208 = "hw:0,0";
    }
    lVar5 = 0;
    while (((pcVar3 = *(char **)(&local_238 + lVar5 * 2), pcVar3 == (char *)0x0 || (*pcVar3 == '\0')
            ) || (iVar1 = (*(pContext->field_14).alsa.snd_pcm_open)
                                    (&local_248,pcVar3,uVar8,(ulong)(uint)openMode), iVar1 != 0))) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 7) {
        ma_log_postf(pContext->pLog,1,
                     "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device."
                    );
        return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
      }
    }
    goto LAB_001abc0f;
  }
  memcpy(&local_238,pDeviceID,0x100);
  if ((char)local_238 == ':') {
    if (local_238._1_1_ == '\0') {
      local_238 = local_238 & 0xffffff00;
    }
    iVar1 = -0x13;
    if (shareMode == ma_share_mode_shared) {
      if (deviceType == ma_device_type_playback) {
        pcVar3 = local_138 + 4;
        cVar4 = 'd';
        lVar5 = 0;
        do {
          local_138[lVar5] = cVar4;
          cVar4 = "dmix"[lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
      }
      else {
        pcVar3 = local_138 + 6;
        cVar4 = 'd';
        lVar5 = 0;
        do {
          local_138[lVar5] = cVar4;
          cVar4 = "dsnoop"[lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
      }
      *pcVar3 = '\0';
      lVar5 = -0x100;
      do {
        if (local_138[lVar5 + 0x100] == '\0') {
          lVar6 = 0;
          goto LAB_001abd63;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
    }
    goto LAB_001abdb0;
  }
  pcVar3 = (char *)&local_238;
LAB_001abbfb:
  iVar1 = (*(pContext->field_14).alsa.snd_pcm_open)(&local_248,pcVar3,uVar8,(ulong)(uint)openMode);
  goto LAB_001abc0a;
  while( true ) {
    local_138[lVar5 + lVar6 + 0x100] = *(char *)((long)&local_238 + lVar6);
    lVar6 = lVar6 + 1;
    if (-lVar6 == lVar5) break;
LAB_001abd63:
    if (*(char *)((long)&local_238 + lVar6) == '\0') {
      local_138[lVar5 + lVar6 + 0x100] = '\0';
      iVar1 = (*(pContext->field_14).alsa.snd_pcm_open)
                        (&local_248,local_138,uVar8,(ulong)(uint)openMode);
      if (iVar1 == 0) {
        iVar1 = 0;
        goto LAB_001abc0a;
      }
      break;
    }
  }
LAB_001abdb0:
  local_138[0] = 'h';
  local_138[1] = 'w';
  local_138[2] = 0;
  lVar5 = -0x100;
  do {
    lVar6 = lVar5;
    if (lVar6 == -1) goto LAB_001abc0a;
    lVar5 = lVar6 + 1;
  } while (local_138[lVar6 + 0x101] != '\0');
  lVar7 = 0;
  do {
    if (*(char *)((long)&local_238 + lVar7) == '\0') {
      local_138[lVar6 + lVar7 + 0x101] = '\0';
      pcVar3 = local_138;
      goto LAB_001abbfb;
    }
    local_138[lVar5 + lVar7 + 0x100] = *(char *)((long)&local_238 + lVar7);
    lVar7 = lVar7 + 1;
  } while (-lVar7 != lVar5);
LAB_001abc0a:
  if (iVar1 < 0) {
    ma_log_postf(pContext->pLog,1,"[ALSA] snd_pcm_open() failed.");
    mVar2 = ma_result_from_errno(-iVar1);
    return mVar2;
  }
LAB_001abc0f:
  *local_240 = local_248;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_context_open_pcm__alsa(ma_context* pContext, ma_share_mode shareMode, ma_device_type deviceType, const ma_device_id* pDeviceID, int openMode, ma_snd_pcm_t** ppPCM)
{
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_stream_t stream;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppPCM != NULL);

    *ppPCM = NULL;
    pPCM = NULL;

    stream = (deviceType == ma_device_type_playback) ? MA_SND_PCM_STREAM_PLAYBACK : MA_SND_PCM_STREAM_CAPTURE;

    if (pDeviceID == NULL) {
        ma_bool32 isDeviceOpen;
        size_t i;

        /*
        We're opening the default device. I don't know if trying anything other than "default" is necessary, but it makes
        me feel better to try as hard as we can get to get _something_ working.
        */
        const char* defaultDeviceNames[] = {
            "default",
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
        };

        if (shareMode == ma_share_mode_exclusive) {
            defaultDeviceNames[1] = "hw";
            defaultDeviceNames[2] = "hw:0";
            defaultDeviceNames[3] = "hw:0,0";
        } else {
            if (deviceType == ma_device_type_playback) {
                defaultDeviceNames[1] = "dmix";
                defaultDeviceNames[2] = "dmix:0";
                defaultDeviceNames[3] = "dmix:0,0";
            } else {
                defaultDeviceNames[1] = "dsnoop";
                defaultDeviceNames[2] = "dsnoop:0";
                defaultDeviceNames[3] = "dsnoop:0,0";
            }
            defaultDeviceNames[4] = "hw";
            defaultDeviceNames[5] = "hw:0";
            defaultDeviceNames[6] = "hw:0,0";
        }

        isDeviceOpen = MA_FALSE;
        for (i = 0; i < ma_countof(defaultDeviceNames); ++i) {
            if (defaultDeviceNames[i] != NULL && defaultDeviceNames[i][0] != '\0') {
                if (((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, defaultDeviceNames[i], stream, openMode) == 0) {
                    isDeviceOpen = MA_TRUE;
                    break;
                }
            }
        }

        if (!isDeviceOpen) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device.");
            return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
        }
    } else {
        /*
        We're trying to open a specific device. There's a few things to consider here:

        miniaudio recongnizes a special format of device id that excludes the "hw", "dmix", etc. prefix. It looks like this: ":0,0", ":0,1", etc. When
        an ID of this format is specified, it indicates to miniaudio that it can try different combinations of plugins ("hw", "dmix", etc.) until it
        finds an appropriate one that works. This comes in very handy when trying to open a device in shared mode ("dmix"), vs exclusive mode ("hw").
        */

        /* May end up needing to make small adjustments to the ID, so make a copy. */
        ma_device_id deviceID = *pDeviceID;
        int resultALSA = -ENODEV;

        if (deviceID.alsa[0] != ':') {
            /* The ID is not in ":0,0" format. Use the ID exactly as-is. */
            resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, deviceID.alsa, stream, openMode);
        } else {
            char hwid[256];

            /* The ID is in ":0,0" format. Try different plugins depending on the shared mode. */
            if (deviceID.alsa[1] == '\0') {
                deviceID.alsa[0] = '\0';  /* An ID of ":" should be converted to "". */
            }

            if (shareMode == ma_share_mode_shared) {
                if (deviceType == ma_device_type_playback) {
                    ma_strcpy_s(hwid, sizeof(hwid), "dmix");
                } else {
                    ma_strcpy_s(hwid, sizeof(hwid), "dsnoop");
                }

                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }

            /* If at this point we still don't have an open device it means we're either preferencing exclusive mode or opening with "dmix"/"dsnoop" failed. */
            if (resultALSA != 0) {
                ma_strcpy_s(hwid, sizeof(hwid), "hw");
                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }
        }

        if (resultALSA < 0) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed.");
            return ma_result_from_errno(-resultALSA);
        }
    }

    *ppPCM = pPCM;
    return MA_SUCCESS;
}